

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hostkey.c
# Opt level: O3

int hostkey_method_ssh_rsa_sha2_512_signv
              (LIBSSH2_SESSION *session,uchar **signature,size_t *signature_len,int veccount,
              iovec *datavec,void **abstract)

{
  int iVar1;
  int iVar2;
  long lVar3;
  EVP_MD_CTX *ctx;
  uchar hash [64];
  EVP_MD_CTX *pEStack_98;
  uchar **local_90;
  size_t *local_88;
  EVP_PKEY *local_80;
  uchar local_78 [72];
  
  local_80 = (EVP_PKEY *)*abstract;
  iVar1 = _libssh2_sha512_init(&pEStack_98);
  iVar2 = -1;
  if (iVar1 != 0) {
    local_90 = signature;
    local_88 = signature_len;
    if (0 < veccount) {
      lVar3 = 0;
      do {
        iVar1 = _libssh2_sha512_update
                          (&pEStack_98,*(void **)((long)&datavec->iov_base + lVar3),
                           *(size_t *)((long)&datavec->iov_len + lVar3));
        if (iVar1 == 0) {
          return -1;
        }
        lVar3 = lVar3 + 0x10;
      } while ((ulong)(uint)veccount << 4 != lVar3);
    }
    iVar1 = _libssh2_sha512_final(&pEStack_98,local_78);
    if (iVar1 != 0) {
      iVar2 = _libssh2_rsa_sha2_sign(session,local_80,local_78,0x40,local_90,local_88);
      iVar2 = -(uint)(iVar2 != 0);
    }
  }
  return iVar2;
}

Assistant:

static int
hostkey_method_ssh_rsa_sha2_512_signv(LIBSSH2_SESSION * session,
                                      unsigned char **signature,
                                      size_t *signature_len,
                                      int veccount,
                                      const struct iovec datavec[],
                                      void **abstract)
{
    libssh2_rsa_ctx *rsactx = (libssh2_rsa_ctx *) (*abstract);

#ifdef _libssh2_rsa_sha2_512_signv
    return _libssh2_rsa_sha2_512_signv(session, signature, signature_len,
                                       veccount, datavec, rsactx);
#else
    int ret;
    int i;
    unsigned char hash[SHA512_DIGEST_LENGTH];
    libssh2_sha512_ctx ctx;

    if(!libssh2_sha512_init(&ctx)) {
        return -1;
    }
    for(i = 0; i < veccount; i++) {
        if(!libssh2_sha512_update(ctx,
                                  datavec[i].iov_base, datavec[i].iov_len)) {
            return -1;
        }
    }
    if(!libssh2_sha512_final(ctx, hash)) {
        return -1;
    }

    ret = _libssh2_rsa_sha2_sign(session, rsactx, hash, SHA512_DIGEST_LENGTH,
                                 signature, signature_len);
    if(ret) {
        return -1;
    }

    return 0;
#endif
}